

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

size_t __thiscall flexbuffers::Builder::Key(Builder *this,char *str,size_t len)

{
  iterator iVar1;
  anon_union_8_3_83789bcb_for_Value_0 aVar2;
  size_type_conflict sloc;
  anon_union_8_3_83789bcb_for_Value_0 local_30;
  anon_union_8_3_83789bcb_for_Value_0 local_28;
  undefined8 local_20;
  
  aVar2.i_ = (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_30.i_ = aVar2.i_;
  WriteBytes(this,str,len + 1);
  local_28.i_ = aVar2.i_;
  if ((this->flags_ & BUILDER_FLAG_SHARE_KEYS) != BUILDER_FLAG_NONE) {
    iVar1 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
            ::find(&(this->key_pool)._M_t,&local_30.u_);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->key_pool)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,flexbuffers::Builder::KeyOffsetCompare,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,flexbuffers::Builder::KeyOffsetCompare,std::allocator<unsigned_long>>
                  *)&this->key_pool,&local_30.u_);
      local_28 = local_30;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buf_,local_30.u_);
      local_30 = (anon_union_8_3_83789bcb_for_Value_0)
                 ((anon_union_8_3_83789bcb_for_Value_0 *)(iVar1._M_node + 1))->i_;
      local_28 = local_30;
    }
  }
  local_20 = 4;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
  emplace_back<flexbuffers::Builder::Value>(&this->stack_,(Value *)&local_28);
  return local_30.i_;
}

Assistant:

size_t Key(const char *str, size_t len) {
    auto sloc = buf_.size();
    WriteBytes(str, len + 1);
    if (flags_ & BUILDER_FLAG_SHARE_KEYS) {
      auto it = key_pool.find(sloc);
      if (it != key_pool.end()) {
        // Already in the buffer. Remove key we just serialized, and use
        // existing offset instead.
        buf_.resize(sloc);
        sloc = *it;
      } else {
        key_pool.insert(sloc);
      }
    }
    stack_.push_back(Value(static_cast<uint64_t>(sloc), FBT_KEY, BIT_WIDTH_8));
    return sloc;
  }